

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O0

Am_Drawonable * GV_a_drawonable(Am_Object *obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Ptr pvVar3;
  Am_Object local_48 [3];
  Am_Object local_30;
  Am_Object owner;
  Am_Object window;
  Am_Drawonable *drawonable;
  Am_Object *obj_local;
  
  Am_Object::Am_Object(&owner);
  Am_Object::Am_Object(&local_30);
  pAVar2 = Am_Object::Get(obj,0x68,1);
  Am_Object::operator=(&owner,pAVar2);
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    Am_Object::Get_Owner(local_48,(Am_Slot_Flags)obj);
    Am_Object::operator=(&local_30,local_48);
    Am_Object::~Am_Object(local_48);
    bVar1 = Am_Object::Valid(&local_30);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&owner,0x7d2,0);
      pvVar3 = Am_Value::operator_cast_to_void_(pAVar2);
      obj_local = (Am_Object *)Am_Drawonable::Narrow(pvVar3);
      if ((Am_Drawonable *)obj_local != (Am_Drawonable *)0x0) goto LAB_002716c0;
    }
  }
  pAVar2 = Am_Object::Get(&Am_Screen,0x7d2,0);
  pvVar3 = Am_Value::operator_cast_to_void_(pAVar2);
  obj_local = (Am_Object *)Am_Drawonable::Narrow(pvVar3);
LAB_002716c0:
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&owner);
  return (Am_Drawonable *)obj_local;
}

Assistant:

Am_Drawonable *
GV_a_drawonable(Am_Object obj)
{
  Am_Drawonable *drawonable;
  Am_Object window, owner;

  // Please don't try to clean this up (i.e. by turning it into a single
  // complicated if statement).  Solaris gcc 2.7.0 produces buggy code
  // if you do. -- rcm
  window = obj.Get(Am_WINDOW, Am_OK_IF_NOT_THERE);
  if (window.Valid()) {
    owner = obj.Get_Owner();
    if (owner.Valid()) {
      drawonable = Am_Drawonable::Narrow(window.Get(Am_DRAWONABLE));
      if (drawonable)
        return drawonable;
    }
  }

  // ELSE...
  // If the object is not valid, or
  // if the object is not in a window yet,
  // or the window's drawonable has not yet been created,
  // then use the drawonable for the root screen.
  drawonable = Am_Drawonable::Narrow(Am_Screen.Get(Am_DRAWONABLE));
  return drawonable;
}